

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O1

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddPointConstraint
          (InverseKinematicsConstraintSet *this,uint body_id,Vector3d *body_point,
          Vector3d *target_pos,float weight)

{
  pointer *ppVVar1;
  pointer *ppMVar2;
  iterator __position;
  iterator iVar3;
  iterator iVar4;
  iterator __position_00;
  iterator __position_01;
  double dVar5;
  float local_70;
  uint local_6c;
  Matrix3_t local_68;
  
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] =
       (double)((ulong)local_68.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[0] & 0xffffffff00000000);
  __position._M_current =
       (this->constraint_type).
       super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = weight;
  local_6c = body_id;
  if (__position._M_current ==
      (this->constraint_type).
      super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
    ::_M_realloc_insert<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>
              (&this->constraint_type,__position,(ConstraintType *)&local_68);
  }
  else {
    *__position._M_current = ConstraintTypePosition;
    (this->constraint_type).
    super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar3._M_current =
       (this->body_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->body_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->body_ids,iVar3,&local_6c)
    ;
  }
  else {
    *iVar3._M_current = local_6c;
    (this->body_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  iVar4._M_current =
       (this->body_points).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->body_points).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3_t,std::allocator<Vector3_t>>::_M_realloc_insert<Vector3_t_const&>
              ((vector<Vector3_t,std::allocator<Vector3_t>> *)&this->body_points,iVar4,body_point);
  }
  else {
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (body_point->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    dVar5 = (body_point->super_Vector3d).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (body_point->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = dVar5;
    ppVVar1 = &(this->body_points).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  iVar4._M_current =
       (this->target_positions).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->target_positions).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3_t,std::allocator<Vector3_t>>::_M_realloc_insert<Vector3_t_const&>
              ((vector<Vector3_t,std::allocator<Vector3_t>> *)&this->target_positions,iVar4,
               target_pos);
  }
  else {
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (target_pos->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    dVar5 = (target_pos->super_Vector3d).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (target_pos->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    ((iVar4._M_current)->super_Vector3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = dVar5;
    ppVVar1 = &(this->target_positions).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 0.0;
  local_68.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = 0.0;
  __position_00._M_current =
       (this->target_orientations).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->target_orientations).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::_M_realloc_insert<Matrix3_t>
              (&this->target_orientations,__position_00,&local_68);
  }
  else {
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    ((__position_00._M_current)->super_Matrix3d).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    ppMVar2 = &(this->target_orientations).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  __position_01._M_current =
       (this->constraint_weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->constraint_weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->constraint_weight,__position_01,
               &local_70);
  }
  else {
    *__position_01._M_current = local_70;
    (this->constraint_weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_01._M_current + 1;
  }
  iVar3._M_current =
       (this->constraint_row_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->constraint_row_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->constraint_row_index,
               iVar3,&this->num_constraints);
  }
  else {
    *iVar3._M_current = this->num_constraints;
    (this->constraint_row_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  this->num_constraints = this->num_constraints + 3;
  return (int)((ulong)((long)(this->constraint_type).
                             super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->constraint_type).
                            super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
}

Assistant:

RBDL_DLLAPI
unsigned int InverseKinematicsConstraintSet::AddPointConstraint(
    unsigned int body_id,
    const Vector3d& body_point,
    const Vector3d& target_pos,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypePosition);
  body_ids.push_back(body_id);
  body_points.push_back(body_point);
  target_positions.push_back(target_pos);
  target_orientations.push_back(Matrix3d::Zero());
  constraint_weight.push_back(weight);
  constraint_row_index.push_back(num_constraints);
  num_constraints = num_constraints + 3;
  return constraint_type.size() - 1;
}